

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::details::file_helper::split_by_extenstion
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,filename_t *fname)

{
  long lVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = std::__cxx11::string::rfind((char)fname,0x2e);
  if ((lVar1 + 1U < 2) || (lVar1 == fname->_M_string_length - 1)) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string_const&,std::__cxx11::string,void>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
               fname,&local_58);
  }
  else {
    uVar2 = std::__cxx11::string::rfind((char)fname,0x2f);
    if (uVar2 < lVar1 - 1U || uVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)fname);
      std::__cxx11::string::substr((ulong)&local_38,(ulong)fname);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_58,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
      _Tuple_impl<std::__cxx11::string_const&,std::__cxx11::string,void>
                ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)
                 __return_storage_ptr__,fname,&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<filename_t, filename_t> split_by_extenstion(const spdlog::filename_t &fname)
    {
        auto ext_index = fname.rfind('.');

        // no valid extension found - return whole path and empty string as extension
        if (ext_index == filename_t::npos || ext_index == 0 || ext_index == fname.size() - 1)
        {
            return std::make_tuple(fname, spdlog::filename_t());
        }

        // treat casese like "/etc/rc.d/somelogfile or "/abc/.hiddenfile"
        auto folder_index = fname.rfind(details::os::folder_sep);
        if (folder_index != fname.npos && folder_index >= ext_index - 1)
        {
            return std::make_tuple(fname, spdlog::filename_t());
        }

        // finally - return a valid base and extension tuple
        return std::make_tuple(fname.substr(0, ext_index), fname.substr(ext_index));
    }